

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FmtHelpers.cpp
# Opt level: O2

bool slang::ast::FmtHelpers::checkDisplayArgs(ASTContext *context,Args *args)

{
  size_t sVar1;
  StringLiteral *arg;
  Type *this;
  bool bVar2;
  pointer ppEVar3;
  Diagnostic *diag;
  iterator iVar4;
  iterator local_38;
  
  ppEVar3 = args->_M_ptr;
  iVar4._M_current = ppEVar3;
  do {
    sVar1 = (args->_M_extent)._M_extent_value;
    if (iVar4._M_current == ppEVar3 + sVar1) {
LAB_002e3c9a:
      return iVar4._M_current == ppEVar3 + sVar1;
    }
    local_38._M_current = iVar4._M_current + 1;
    arg = (StringLiteral *)*iVar4._M_current;
    bVar2 = Expression::bad((Expression *)arg);
    if (bVar2) goto LAB_002e3c9a;
    if ((arg->super_Expression).kind == StringLiteral) {
      bVar2 = checkFormatString(context,arg,&local_38,
                                (iterator)(args->_M_ptr + (args->_M_extent)._M_extent_value));
      if (!bVar2) goto LAB_002e3c9a;
    }
    else {
      this = (arg->super_Expression).type.ptr;
      bVar2 = Type::isAggregate(this);
      if ((bVar2) && (bVar2 = Type::isByteArray(this), !bVar2)) {
        diag = ASTContext::addDiag(context,(DiagCode)0x17000b,(arg->super_Expression).sourceRange);
        ast::operator<<(diag,this);
        goto LAB_002e3c9a;
      }
    }
    ppEVar3 = args->_M_ptr;
    iVar4._M_current = local_38._M_current;
  } while( true );
}

Assistant:

bool FmtHelpers::checkDisplayArgs(const ASTContext& context, const Args& args) {
    auto argIt = args.begin();
    while (argIt != args.end()) {
        auto arg = *argIt++;
        if (arg->bad())
            return false;

        // Handle string literals as format strings.
        if (arg->kind == ExpressionKind::StringLiteral) {
            if (!checkFormatString(context, arg->as<StringLiteral>(), argIt, args.end()))
                return false;
        }
        else {
            const Type& type = *arg->type;
            if (type.isAggregate() && !type.isByteArray()) {
                context.addDiag(diag::FormatUnspecifiedType, arg->sourceRange) << type;
                return false;
            }
        }
    }

    return true;
}